

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3PCacheBufferSetup(void *pBuf,int sz,int n)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  
  if (pcache1_g.isInit != 0) {
    pcache1_g.szSlot = sz & 0xfffffff8;
    pcache1_g.nSlot = n;
    if (pBuf == (void *)0x0) {
      pcache1_g.nSlot = 0;
      pcache1_g.szSlot = 0;
    }
    if (pcache1_g.nSlot < 0x5b) {
      pcache1_g.nReserve = pcache1_g.nSlot / 10 + 1;
      if (pcache1_g.nSlot == 0) {
        pcache1_g.pStart = pBuf;
        pcache1_g.pEnd = pBuf;
        pcache1_g.pFree = (PgFreeslot *)0x0;
        pcache1_g.nFreeSlot = pcache1_g.nSlot;
        pcache1_g.bUnderPressure = 0;
        return;
      }
    }
    else {
      pcache1_g.nReserve = 10;
    }
    pcache1_g.bUnderPressure = 0;
    lVar1 = (long)pcache1_g.szSlot;
    puVar2 = (undefined8 *)0x0;
    pcache1_g.pStart = pBuf;
    pcache1_g.nFreeSlot = pcache1_g.nSlot;
    iVar3 = pcache1_g.nSlot;
    do {
      *(undefined8 **)pBuf = puVar2;
      pcache1_g.pEnd = (void *)((long)pBuf + lVar1);
      iVar3 = iVar3 + -1;
      puVar2 = (undefined8 *)pBuf;
      pBuf = pcache1_g.pEnd;
    } while (iVar3 != 0);
    pcache1_g.pFree = (PgFreeslot *)((long)pcache1_g.pEnd - lVar1);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PCacheBufferSetup(void *pBuf, int sz, int n){
  if( pcache1.isInit ){
    PgFreeslot *p;
    if( pBuf==0 ) sz = n = 0;
    sz = ROUNDDOWN8(sz);
    pcache1.szSlot = sz;
    pcache1.nSlot = pcache1.nFreeSlot = n;
    pcache1.nReserve = n>90 ? 10 : (n/10 + 1);
    pcache1.pStart = pBuf;
    pcache1.pFree = 0;
    pcache1.bUnderPressure = 0;
    while( n-- ){
      p = (PgFreeslot*)pBuf;
      p->pNext = pcache1.pFree;
      pcache1.pFree = p;
      pBuf = (void*)&((char*)pBuf)[sz];
    }
    pcache1.pEnd = pBuf;
  }
}